

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

UBool __thiscall
icu_63::RuleBasedTimeZone::inDaylightTime(RuleBasedTimeZone *this,UDate date,UErrorCode *status)

{
  UBool UVar1;
  int local_30;
  undefined1 local_2c [4];
  int32_t dst;
  int32_t raw;
  UErrorCode *status_local;
  UDate date_local;
  RuleBasedTimeZone *this_local;
  
  _dst = status;
  status_local = (UErrorCode *)date;
  date_local = (UDate)this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[6])
              (status_local,this,0,local_2c,&local_30,_dst);
    if (local_30 == 0) {
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = '\x01';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
RuleBasedTimeZone::inDaylightTime(UDate date, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return FALSE;
    }
    int32_t raw, dst;
    getOffset(date, FALSE, raw, dst, status);
    if (dst != 0) {
        return TRUE;
    }
    return FALSE;
}